

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NaPNStat.cpp
# Opt level: O0

void __thiscall NaPNStatistics::NaPNStatistics(NaPNStatistics *this,char *szNodeName)

{
  undefined8 *in_RDI;
  char *in_stack_000003c8;
  NaPetriNode *in_stack_000003d0;
  undefined8 in_stack_ffffffffffffff98;
  uint uVar1;
  NaVector *in_stack_ffffffffffffffa0;
  NaVector *this_00;
  NaPetriNode *in_stack_ffffffffffffffa8;
  NaPetriCnInput *in_stack_ffffffffffffffb0;
  NaPetriNode *in_stack_ffffffffffffffb8;
  NaPetriCnOutput *in_stack_ffffffffffffffc0;
  
  uVar1 = (uint)((ulong)in_stack_ffffffffffffff98 >> 0x20);
  NaPetriNode::NaPetriNode(in_stack_000003d0,in_stack_000003c8);
  *in_RDI = &PTR__NaPNStatistics_00195938;
  NaPetriCnInput::NaPetriCnInput
            (in_stack_ffffffffffffffb0,in_stack_ffffffffffffffa8,(char *)in_stack_ffffffffffffffa0);
  NaPetriCnOutput::NaPetriCnOutput
            (in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb8,(char *)in_stack_ffffffffffffffb0);
  NaVector::NaVector(in_stack_ffffffffffffffa0,uVar1);
  NaVector::NaVector(in_stack_ffffffffffffffa0,uVar1);
  NaVector::NaVector(in_stack_ffffffffffffffa0,uVar1);
  NaVector::NaVector(in_stack_ffffffffffffffa0,uVar1);
  this_00 = (NaVector *)(in_RDI + 0x2e);
  NaVector::NaVector(this_00,uVar1);
  *(undefined4 *)(in_RDI + 0x31) = 0x3ff;
  *(undefined4 *)((long)in_RDI + 0x18c) = 0;
  uVar1 = (uint)((ulong)(in_RDI + 0x33) >> 0x20);
  NaVector::NaVector(this_00,uVar1);
  NaVector::NaVector(this_00,uVar1);
  *(undefined4 *)(in_RDI + 0x39) = 0;
  return;
}

Assistant:

NaPNStatistics::NaPNStatistics (const char* szNodeName)
  : NaPetriNode(szNodeName), mOutStat(NaSM_ALL), mHalt(0), nGapWidth(0),
  ////////////////
  // Connectors //
  ////////////////
  signal(this, "signal"),
  stat(this, "stat")
{
    // Nothing to do
}